

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O2

int __thiscall Jupiter::HTTP::Server::bind(Server *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  Socket *pSVar1;
  int iVar2;
  undefined4 in_register_00000034;
  allocator<char> local_59;
  Socket *local_58;
  _Head_base<0UL,_Jupiter::Socket_*,_false> local_50 [4];
  string_view hostname_local;
  
  hostname_local._M_len = CONCAT44(in_register_00000034,__fd);
  hostname_local._M_str = (char *)__addr;
  std::make_unique<Jupiter::TCPSocket>();
  pSVar1 = local_58;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_50,&hostname_local,&local_59);
  iVar2 = (*pSVar1->_vptr_Socket[2])(pSVar1,local_50[0]._M_head_impl,(ulong)(__len & 0xffff),1);
  std::__cxx11::string::~string((string *)local_50);
  if ((char)iVar2 != '\0') {
    Socket::setBlocking(local_58,false);
    local_50[0]._M_head_impl = local_58;
    local_58 = (Socket *)0x0;
    std::
    vector<std::unique_ptr<Jupiter::Socket,std::default_delete<Jupiter::Socket>>,std::allocator<std::unique_ptr<Jupiter::Socket,std::default_delete<Jupiter::Socket>>>>
    ::emplace_back<std::unique_ptr<Jupiter::Socket,std::default_delete<Jupiter::Socket>>>
              ((vector<std::unique_ptr<Jupiter::Socket,std::default_delete<Jupiter::Socket>>,std::allocator<std::unique_ptr<Jupiter::Socket,std::default_delete<Jupiter::Socket>>>>
                *)&this->m_data->m_ports,
               (unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_> *)local_50);
    if (local_50[0]._M_head_impl != (Socket *)0x0) {
      (*(local_50[0]._M_head_impl)->_vptr_Socket[0xe])();
    }
  }
  if (local_58 != (Socket *)0x0) {
    (*local_58->_vptr_Socket[0xe])();
  }
  return iVar2;
}

Assistant:

bool Jupiter::HTTP::Server::bind(std::string_view hostname, uint16_t port) {
	auto socket = std::make_unique<Jupiter::TCPSocket>();
	if (socket->bind(static_cast<std::string>(hostname).c_str(), port, true)) {
		socket->setBlocking(false);
		m_data->m_ports.push_back(std::move(socket));
		return true;
	}

	return false;
}